

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_reset_auto_extension(void)

{
  int iVar1;
  sqlite3_mutex *p;
  sqlite3_mutex *mutex;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    p = sqlite3MutexAlloc(2);
    sqlite3_mutex_enter(p);
    sqlite3_free(sqlite3Autoext.aExt);
    sqlite3Autoext.aExt = (_func_void **)0x0;
    sqlite3Autoext.nExt = 0;
    sqlite3_mutex_leave(p);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_reset_auto_extension(void){
#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize()==SQLITE_OK )
#endif
  {
#if SQLITE_THREADSAFE
    sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
#endif
    wsdAutoextInit;
    sqlite3_mutex_enter(mutex);
    sqlite3_free(wsdAutoext.aExt);
    wsdAutoext.aExt = 0;
    wsdAutoext.nExt = 0;
    sqlite3_mutex_leave(mutex);
  }
}